

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void blowfish_msb_decrypt_cbc(uchar *blk,int len,BlowfishContext *ctx)

{
  uint value;
  uint local_38;
  uint local_34;
  uint32_t iv1;
  uint32_t iv0;
  uint32_t out [2];
  uint32_t xR;
  uint32_t xL;
  BlowfishContext *ctx_local;
  uchar *puStack_10;
  int len_local;
  uchar *blk_local;
  
  if ((len & 7U) == 0) {
    local_34 = ctx->iv0;
    local_38 = ctx->iv1;
    puStack_10 = blk;
    for (ctx_local._4_4_ = len; 0 < ctx_local._4_4_; ctx_local._4_4_ = ctx_local._4_4_ + -8) {
      out[1] = GET_32BIT_MSB_FIRST(puStack_10);
      out[0] = GET_32BIT_MSB_FIRST(puStack_10 + 4);
      blowfish_decrypt(out[1],out[0],&iv1,ctx);
      value = iv0 ^ local_38;
      PUT_32BIT_MSB_FIRST(puStack_10,iv1 ^ local_34);
      PUT_32BIT_MSB_FIRST(puStack_10 + 4,value);
      local_34 = out[1];
      local_38 = out[0];
      puStack_10 = puStack_10 + 8;
    }
    ctx->iv0 = local_34;
    ctx->iv1 = local_38;
    return;
  }
  __assert_fail("(len & 7) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                ,0x199,"void blowfish_msb_decrypt_cbc(unsigned char *, int, BlowfishContext *)");
}

Assistant:

static void blowfish_msb_decrypt_cbc(unsigned char *blk, int len,
                                     BlowfishContext * ctx)
{
    uint32_t xL, xR, out[2], iv0, iv1;

    assert((len & 7) == 0);

    iv0 = ctx->iv0;
    iv1 = ctx->iv1;

    while (len > 0) {
        xL = GET_32BIT_MSB_FIRST(blk);
        xR = GET_32BIT_MSB_FIRST(blk + 4);
        blowfish_decrypt(xL, xR, out, ctx);
        iv0 ^= out[0];
        iv1 ^= out[1];
        PUT_32BIT_MSB_FIRST(blk, iv0);
        PUT_32BIT_MSB_FIRST(blk + 4, iv1);
        iv0 = xL;
        iv1 = xR;
        blk += 8;
        len -= 8;
    }

    ctx->iv0 = iv0;
    ctx->iv1 = iv1;
}